

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_enc.c
# Opt level: O2

int PostLoopFinalize(VP8EncIterator *it,int ok)

{
  VP8Encoder *enc;
  int iVar1;
  uint64_t (*pauVar2) [3];
  int i;
  uint64_t (*pauVar3) [3];
  long lVar4;
  VP8BitWriter *bw;
  int p;
  long lVar5;
  int (*paiVar6) [4];
  
  enc = it->enc_;
  if (ok != 0) {
    bw = enc->parts_;
    for (lVar5 = 0; lVar5 < enc->num_parts_; lVar5 = lVar5 + 1) {
      VP8BitWriterFinish(bw);
      ok = ok & (uint)(bw->error_ == 0);
      bw = bw + 1;
    }
    if (ok != 0) {
      if (enc->pic_->stats != (WebPAuxStats *)0x0) {
        pauVar2 = it->bit_count_;
        paiVar6 = enc->residual_bytes_;
        for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
          pauVar3 = pauVar2;
          for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
            (*paiVar6)[lVar4] = (int)((*pauVar3)[0] + 7 >> 3);
            pauVar3 = pauVar3 + 1;
          }
          pauVar2 = (uint64_t (*) [3])(*pauVar2 + 1);
          paiVar6 = paiVar6 + 1;
        }
      }
      VP8AdjustFilterStrength(it);
      return ok;
    }
  }
  VP8EncFreeBitWriters(enc);
  iVar1 = WebPEncodingSetError(enc->pic_,VP8_ENC_ERROR_OUT_OF_MEMORY);
  return iVar1;
}

Assistant:

static int PostLoopFinalize(VP8EncIterator* const it, int ok) {
  VP8Encoder* const enc = it->enc_;
  if (ok) {      // Finalize the partitions, check for extra errors.
    int p;
    for (p = 0; p < enc->num_parts_; ++p) {
      VP8BitWriterFinish(enc->parts_ + p);
      ok &= !enc->parts_[p].error_;
    }
  }

  if (ok) {      // All good. Finish up.
#if !defined(WEBP_DISABLE_STATS)
    if (enc->pic_->stats != NULL) {  // finalize byte counters...
      int i, s;
      for (i = 0; i <= 2; ++i) {
        for (s = 0; s < NUM_MB_SEGMENTS; ++s) {
          enc->residual_bytes_[i][s] = (int)((it->bit_count_[s][i] + 7) >> 3);
        }
      }
    }
#endif
    VP8AdjustFilterStrength(it);     // ...and store filter stats.
  } else {
    // Something bad happened -> need to do some memory cleanup.
    VP8EncFreeBitWriters(enc);
    return WebPEncodingSetError(enc->pic_, VP8_ENC_ERROR_OUT_OF_MEMORY);
  }
  return ok;
}